

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.cc
# Opt level: O0

void __thiscall
S2CellId::AppendAllNeighbors
          (S2CellId *this,int nbr_level,vector<S2CellId,_std::allocator<S2CellId>_> *output)

{
  vector<S2CellId,_std::allocator<S2CellId>_> *pvVar1;
  int iVar2;
  ostream *poVar3;
  bool local_129;
  bool local_111;
  S2CellId local_c1;
  value_type local_b9;
  S2CellId local_b1;
  value_type local_a9;
  S2CellId local_a1;
  value_type local_99;
  S2CellId local_91;
  value_type local_89;
  byte local_81;
  int local_80;
  bool same_face;
  int k;
  S2LogMessageVoidify local_61;
  int local_60;
  int local_5c;
  int nbr_size;
  int size;
  int face;
  int j;
  int i;
  byte local_39;
  S2LogMessage local_38;
  S2LogMessageVoidify local_21;
  vector<S2CellId,_std::allocator<S2CellId>_> *local_20;
  vector<S2CellId,_std::allocator<S2CellId>_> *output_local;
  S2CellId *pSStack_10;
  int nbr_level_local;
  S2CellId *this_local;
  
  local_20 = output;
  output_local._4_4_ = nbr_level;
  pSStack_10 = this;
  iVar2 = level(this);
  local_39 = 0;
  if (nbr_level < iVar2) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.cc"
               ,0x223,kFatal,(ostream *)&std::cerr);
    local_39 = 1;
    poVar3 = S2LogMessage::stream(&local_38);
    poVar3 = std::operator<<(poVar3,"Check failed: (nbr_level) >= (level()) ");
    S2LogMessageVoidify::operator&(&local_21,poVar3);
  }
  if ((local_39 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_38);
  }
  nbr_size = ToFaceIJOrientation(this,&face,&size,(int *)0x0);
  local_5c = GetSizeIJ(this);
  face = -local_5c & face;
  size = -local_5c & size;
  local_60 = GetSizeIJ(output_local._4_4_);
  same_face = false;
  if (local_5c < local_60) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&k,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.cc"
               ,0x22f,kFatal,(ostream *)&std::cerr);
    same_face = true;
    poVar3 = S2LogMessage::stream((S2LogMessage *)&k);
    poVar3 = std::operator<<(poVar3,"Check failed: (nbr_size) <= (size) ");
    S2LogMessageVoidify::operator&(&local_61,poVar3);
  }
  if ((same_face & 1U) == 0) {
    local_80 = -local_60;
    while( true ) {
      pvVar1 = local_20;
      if (local_80 < 0) {
        local_81 = -1 < size + local_80;
      }
      else if (local_80 < local_5c) {
        local_81 = 1;
        local_91 = FromFaceIJSame(nbr_size,face + local_80,size - local_60,-1 < size - local_5c);
        local_89.id_ = (uint64)parent(&local_91,output_local._4_4_);
        std::vector<S2CellId,_std::allocator<S2CellId>_>::push_back(pvVar1,&local_89);
        pvVar1 = local_20;
        local_a1 = FromFaceIJSame(nbr_size,face + local_80,size + local_5c,
                                  size + local_5c < 0x40000000);
        local_99.id_ = (uint64)parent(&local_a1,output_local._4_4_);
        std::vector<S2CellId,_std::allocator<S2CellId>_>::push_back(pvVar1,&local_99);
      }
      else {
        local_81 = size + local_80 < 0x40000000;
      }
      pvVar1 = local_20;
      local_111 = (local_81 & 1) != 0 && -1 < face - local_5c;
      local_b1 = FromFaceIJSame(nbr_size,face - local_60,size + local_80,local_111);
      local_a9.id_ = (uint64)parent(&local_b1,output_local._4_4_);
      std::vector<S2CellId,_std::allocator<S2CellId>_>::push_back(pvVar1,&local_a9);
      pvVar1 = local_20;
      local_129 = (local_81 & 1) != 0 && face + local_5c < 0x40000000;
      local_c1 = FromFaceIJSame(nbr_size,face + local_5c,size + local_80,local_129);
      local_b9.id_ = (uint64)parent(&local_c1,output_local._4_4_);
      std::vector<S2CellId,_std::allocator<S2CellId>_>::push_back(pvVar1,&local_b9);
      if (local_5c <= local_80) break;
      local_80 = local_60 + local_80;
    }
    return;
  }
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&k);
}

Assistant:

void S2CellId::AppendAllNeighbors(int nbr_level,
                                  vector<S2CellId>* output) const {
  S2_DCHECK_GE(nbr_level, level());
  int i, j;
  int face = ToFaceIJOrientation(&i, &j, nullptr);

  // Find the coordinates of the lower left-hand leaf cell.  We need to
  // normalize (i,j) to a known position within the cell because nbr_level
  // may be larger than this cell's level.
  int size = GetSizeIJ();
  i &= -size;
  j &= -size;

  int nbr_size = GetSizeIJ(nbr_level);
  S2_DCHECK_LE(nbr_size, size);

  // We compute the top-bottom, left-right, and diagonal neighbors in one
  // pass.  The loop test is at the end of the loop to avoid 32-bit overflow.
  for (int k = -nbr_size; ; k += nbr_size) {
    bool same_face;
    if (k < 0) {
      same_face = (j + k >= 0);
    } else if (k >= size) {
      same_face = (j + k < kMaxSize);
    } else {
      same_face = true;
      // Top and bottom neighbors.
      output->push_back(FromFaceIJSame(face, i + k, j - nbr_size,
                                       j - size >= 0).parent(nbr_level));
      output->push_back(FromFaceIJSame(face, i + k, j + size,
                                       j + size < kMaxSize).parent(nbr_level));
    }
    // Left, right, and diagonal neighbors.
    output->push_back(FromFaceIJSame(face, i - nbr_size, j + k,
                                     same_face && i - size >= 0)
                      .parent(nbr_level));
    output->push_back(FromFaceIJSame(face, i + size, j + k,
                                     same_face && i + size < kMaxSize)
                      .parent(nbr_level));
    if (k >= size) break;
  }
}